

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int form_driver(FORM *form,int c)

{
  _Bool _Var1;
  int *piVar2;
  FIELD *pFVar3;
  ulong uVar4;
  ushort **ppuVar5;
  Generic_Method fct;
  size_t method;
  size_t nMethods;
  Binding_Info *pBStack_28;
  int res;
  Binding_Info *BI;
  int c_local;
  FORM *form_local;
  
  pBStack_28 = (Binding_Info *)0x0;
  nMethods._4_4_ = -8;
  if (form == (FORM *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = -2;
    form_local._4_4_ = -2;
  }
  else if (form->field == (FIELD **)0x0) {
    piVar2 = __errno_location();
    *piVar2 = -0xb;
    form_local._4_4_ = -0xb;
  }
  else {
    if (form->page == (_PAGE *)0x0) {
      __assert_fail("form->page != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                    ,0xe6a,"int form_driver(FORM *, int)");
    }
    if (c == -0x470f0) {
      pFVar3 = _nc_First_Active_Field(form);
      form->current = pFVar3;
      form_local._4_4_ = 0;
    }
    else {
      if (((form->current == (FIELD *)0x0) || (form->current->buf == (char *)0x0)) ||
         (form->current->form != form)) {
        __assert_fail("form->current && form->current->buf && (form->current->form == form)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                      ,0xe75,"int form_driver(FORM *, int)");
      }
      if ((form->status & 2) == 0) {
        if ((form->status & 1) == 0) {
          piVar2 = __errno_location();
          *piVar2 = -7;
          form_local._4_4_ = -7;
        }
        else {
          if (((0x1ff < c) && (c < 0x239)) && ((bindings[c + -0x200].keycode & 0xffffU) == c)) {
            pBStack_28 = bindings + (c + -0x200);
          }
          if (pBStack_28 == (Binding_Info *)0x0) {
            if ((((c & 0xffffff00U) == 0) &&
                (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(c & 0xff)] & 0x4000) != 0)) &&
               (_Var1 = Check_Char(form->current->type,c,(TypeArgument *)form->current->arg), _Var1)
               ) {
              nMethods._4_4_ = Data_Entry(form,c);
            }
          }
          else {
            uVar4 = (ulong)((uint)pBStack_28->keycode >> 0x10);
            if ((uVar4 < 9) && (pBStack_28->cmd != (_func_int_FORM_ptr *)0x0)) {
              if (form_driver::Generic_Methods[uVar4] == (Generic_Method)0x0) {
                nMethods._4_4_ = (*pBStack_28->cmd)(form);
              }
              else {
                nMethods._4_4_ = (*form_driver::Generic_Methods[uVar4])(pBStack_28->cmd,form);
              }
            }
            else {
              nMethods._4_4_ = -1;
            }
          }
          _nc_Refresh_Current_Field(form);
          piVar2 = __errno_location();
          *piVar2 = nMethods._4_4_;
          form_local._4_4_ = nMethods._4_4_;
        }
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = -5;
        form_local._4_4_ = -5;
      }
    }
  }
  return form_local._4_4_;
}

Assistant:

int form_driver(FORM * form, int  c)
{
  const Binding_Info* BI = (Binding_Info *)0;
  int res = E_UNKNOWN_COMMAND;

  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (!(form->field))
    RETURN(E_NOT_CONNECTED);
  
  assert(form->page != 0);
  
  if (c==FIRST_ACTIVE_MAGIC)
    {
      form->current = _nc_First_Active_Field(form);
      return E_OK;
    }
  
  assert(form->current && 
         form->current->buf && 
         (form->current->form == form)
        );
  
  if ( form->status & _IN_DRIVER )
    RETURN(E_BAD_STATE);

  if ( !( form->status & _POSTED ) ) 
    RETURN(E_NOT_POSTED);
  
  if ((c>=MIN_FORM_COMMAND && c<=MAX_FORM_COMMAND) &&
      ((bindings[c-MIN_FORM_COMMAND].keycode & Key_Mask) == c))
    BI = &(bindings[c-MIN_FORM_COMMAND]);
  
  if (BI)
    {
      typedef int (*Generic_Method)(int (* const)(FORM *),FORM *);
      static const Generic_Method Generic_Methods[] = 
        {
          Page_Navigation,         /* overloaded to call field&form hooks */
          Inter_Field_Navigation,  /* overloaded to call field hooks      */
          NULL,                    /* Intra-Field is generic              */
          Vertical_Scrolling,      /* Overloaded to check multi-line      */
          Horizontal_Scrolling,    /* Overloaded to check single-line     */
          Field_Editing,           /* Overloaded to mark modification     */
          NULL,                    /* Edit Mode is generic                */
          NULL,                    /* Field Validation is generic         */
          NULL                     /* Choice Request is generic           */
        };
      size_t nMethods = (sizeof(Generic_Methods)/sizeof(Generic_Methods[0]));
      size_t method   = ((BI->keycode & ID_Mask) >> ID_Shft) & 0xffff;
      
      if ( (method >= nMethods) || !(BI->cmd) )
        res = E_SYSTEM_ERROR;
      else
        {
          Generic_Method fct = Generic_Methods[method];
          if (fct)
            res = fct(BI->cmd,form);
          else
            res = (BI->cmd)(form);
        }
    } 
  else 
    {
      if (!(c & (~(int)MAX_REGULAR_CHARACTER)) &&
          isprint((unsigned char)c) &&                      
          Check_Char(form->current->type,c,
                     (TypeArgument *)(form->current->arg)))
        res = Data_Entry(form,c);
    }
  _nc_Refresh_Current_Field(form);
  RETURN(res);
}